

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O3

color_quad_u8 __thiscall
crnlib::dxt1_block::unpack_endpoint
          (dxt1_block *this,uint32 endpoints,uint index,bool scaled,uint alpha)

{
  byte bVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = endpoints >> ((byte)(index << 4) & 0x1f);
  uVar3 = uVar4 & 0x1f;
  uVar6 = uVar4 >> 5 & 0x3f;
  uVar2 = (uVar4 & 0xffff) >> 0xb;
  bVar1 = (byte)uVar2;
  if ((int)CONCAT71(in_register_00000009,scaled) != 0) {
    uVar3 = (uVar3 >> 2) + uVar3 * 8;
    uVar6 = (uVar6 >> 4) + uVar6 * 4;
    bVar1 = (byte)((short)uVar2 << 3) | (byte)(uVar4 >> 8) >> 5;
  }
  uVar5 = 0xff;
  if (alpha < 0xff) {
    uVar5 = alpha;
  }
  this->m_low_color[0] = bVar1;
  this->m_low_color[1] = (uint8)uVar6;
  this->m_high_color[0] = (uint8)uVar3;
  this->m_high_color[1] = (uint8)uVar5;
  return (color_quad_u8)SUB84(this,0);
}

Assistant:

color_quad_u8 dxt1_block::unpack_endpoint(uint32 endpoints, uint index, bool scaled, uint alpha) {
  CRNLIB_ASSERT(index < 2);
  return unpack_color(static_cast<uint16>((endpoints >> (index * 16U)) & 0xFFFFU), scaled, alpha);
}